

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O1

void y4m_convert_422_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int _c_h;
  int iVar1;
  int _c_w;
  uchar *_dst_00;
  int iVar2;
  uchar *_dst_01;
  
  _c_h = _y4m->pic_h;
  _dst_01 = _dst + _c_h * _y4m->pic_w;
  _c_w = (_y4m->pic_w + _y4m->src_c_dec_h + -1) / _y4m->src_c_dec_h;
  iVar1 = _y4m->dst_c_dec_v;
  _dst_00 = _aux + _c_w * _c_h * 2;
  iVar2 = 2;
  do {
    y4m_42xmpeg2_42xjpeg_helper(_dst_00,_aux,_c_w,_c_h);
    y4m_422jpeg_420jpeg_helper(_dst_01,_dst_00,_c_w,_c_h);
    _aux = _aux + _c_w * _c_h;
    _dst_01 = _dst_01 + ((_c_h + iVar1 + -1) / iVar1) * _c_w;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void y4m_convert_422_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_h;
  int dst_c_sz;
  int pli;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = c_w * dst_c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*In reality, the horizontal and vertical steps could be pipelined, for
       less memory consumption and better cache performance, but we do them
       separately for simplicity.*/
    /*First do horizontal filtering (convert to 422jpeg)*/
    y4m_42xmpeg2_42xjpeg_helper(tmp, _aux, c_w, c_h);
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, c_w, c_h);
    _aux += c_sz;
    _dst += dst_c_sz;
  }
}